

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t bid_keyword_list(char *p,ssize_t len,wchar_t unset,wchar_t last_is_path)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  wchar_t wVar5;
  ulong uVar6;
  wchar_t wVar7;
  long lVar8;
  char *p_00;
  byte bVar9;
  undefined8 *puVar10;
  
  wVar7 = L'\0';
  do {
    do {
      if (len < 1) {
        return wVar7;
      }
      if (*p == '\0') {
        return wVar7;
      }
      pcVar1 = p + len;
      bVar9 = 0;
      for (; 0 < len; len = len + -1) {
        cVar2 = *p;
        if ((cVar2 != ' ') && (p_00 = p, cVar2 != '\t')) goto LAB_00147897;
        p = p + 1;
        bVar9 = 1;
      }
      cVar2 = *pcVar1;
      len = 0;
      p_00 = pcVar1;
LAB_00147897:
      cVar3 = cVar2;
      if (cVar2 == '\\') {
        cVar3 = p_00[1];
      }
      if (cVar3 == '\n') {
        return wVar7;
      }
      if (cVar3 == '\r') {
        return wVar7;
      }
      if ((bool)(last_is_path == L'\0' & (bVar9 ^ 1))) {
        return L'\xffffffff';
      }
      if ((last_is_path != L'\0') && (len == 0)) {
        return wVar7;
      }
      if ((unset != L'\0') && (wVar5 = bid_keycmp(p_00,"all",len), L'\0' < wVar5)) {
        return L'\x01';
      }
      bVar9 = cVar2 + 0x9d;
      if (0x12 < bVar9) {
        return L'\xffffffff';
      }
      if ((0x79e5bU >> (bVar9 & 0x1f) & 1) == 0) {
        return L'\xffffffff';
      }
      puVar10 = (undefined8 *)(&DAT_00226ef0 + *(int *)(&DAT_00226ef0 + (ulong)bVar9 * 4));
      do {
        if ((char *)*puVar10 == (char *)0x0) {
          return L'\xffffffff';
        }
        wVar5 = bid_keycmp(p_00,(char *)*puVar10,len);
        puVar10 = puVar10 + 1;
      } while (wVar5 < L'\x01');
      uVar6 = (ulong)(uint)wVar5;
      p = p_00 + uVar6;
      len = len - uVar6;
      wVar7 = wVar7 + L'\x01';
    } while (p_00[uVar6] != '=');
    p = p_00 + uVar6;
    bVar9 = 0;
    do {
      bVar4 = bVar9;
      lVar8 = len;
      p = p + 1;
      if ((lVar8 < 2) || (*p == ' ')) break;
      len = lVar8 + -1;
      bVar9 = 1;
    } while (*p != '\t');
    len = lVar8 + -1;
    if (!(bool)(unset != L'\0' | bVar4)) {
      return L'\xffffffff';
    }
  } while( true );
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}